

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# late_materialization.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::LateMaterialization::GetExpression
          (LateMaterialization *this,LogicalOperator *op,idx_t column_index)

{
  pointer pcVar1;
  LogicalGet *this_00;
  vector<duckdb::ColumnIndex,_true> *this_01;
  const_reference index;
  string *psVar2;
  LogicalType *args_1;
  reference this_02;
  pointer pEVar3;
  InternalException *this_03;
  size_type in_RCX;
  string column_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  _func_int **local_48;
  ColumnBinding local_40;
  
  if (*(char *)(column_index + 8) == '\x01') {
    this_02 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                            *)(column_index + 0x28),in_RCX);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_02);
    (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[0x11])(this,pEVar3);
  }
  else {
    if (*(char *)(column_index + 8) != '\x19') {
      this_03 = (InternalException *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,
                 "Unsupported operator type for LateMaterialization::GetExpression","");
      InternalException::InternalException(this_03,&local_68);
      __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_00 = LogicalOperator::Cast<duckdb::LogicalGet>((LogicalOperator *)column_index);
    this_01 = LogicalGet::GetColumnIds(this_00);
    index = vector<duckdb::ColumnIndex,_true>::operator[](this_01,in_RCX);
    psVar2 = LogicalGet::GetColumnName_abi_cxx11_(this_00,index);
    pcVar1 = (psVar2->_M_dataplus)._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + psVar2->_M_string_length);
    args_1 = LogicalGet::GetColumnType(this_00,index);
    local_40.table_index = this_00->table_index;
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string&,duckdb::LogicalType_const&,duckdb::ColumnBinding>
              ((duckdb *)&local_48,&local_68,args_1,&local_40);
    (this->super_BaseColumnPruner).super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor =
         local_48;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> LateMaterialization::GetExpression(LogicalOperator &op, idx_t column_index) {
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_GET: {
		auto &get = op.Cast<LogicalGet>();
		auto &column_id = get.GetColumnIds()[column_index];
		auto column_name = get.GetColumnName(column_id);
		auto &column_type = get.GetColumnType(column_id);
		auto expr =
		    make_uniq<BoundColumnRefExpression>(column_name, column_type, ColumnBinding(get.table_index, column_index));
		return std::move(expr);
	}
	case LogicalOperatorType::LOGICAL_PROJECTION:
		return op.expressions[column_index]->Copy();
	default:
		throw InternalException("Unsupported operator type for LateMaterialization::GetExpression");
	}
}